

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

double aom_noise_strength_lut_eval(aom_noise_strength_lut_t *lut,double x)

{
  double dVar1;
  double a;
  int i;
  double x_local;
  aom_noise_strength_lut_t *lut_local;
  double local_8;
  
  if ((*lut->points)[0] <= x) {
    for (i = 0; i < lut->num_points + -1; i = i + 1) {
      if ((lut->points[i][0] <= x) && (x <= lut->points[i + 1][0])) {
        dVar1 = (x - lut->points[i][0]) / (lut->points[i + 1][0] - lut->points[i][0]);
        return lut->points[i + 1][1] * dVar1 + lut->points[i][1] * (1.0 - dVar1);
      }
    }
    local_8 = lut->points[lut->num_points + -1][1];
  }
  else {
    local_8 = (*lut->points)[1];
  }
  return local_8;
}

Assistant:

double aom_noise_strength_lut_eval(const aom_noise_strength_lut_t *lut,
                                   double x) {
  int i = 0;
  // Constant extrapolation for x <  x_0.
  if (x < lut->points[0][0]) return lut->points[0][1];
  for (i = 0; i < lut->num_points - 1; ++i) {
    if (x >= lut->points[i][0] && x <= lut->points[i + 1][0]) {
      const double a =
          (x - lut->points[i][0]) / (lut->points[i + 1][0] - lut->points[i][0]);
      return lut->points[i + 1][1] * a + lut->points[i][1] * (1.0 - a);
    }
  }
  // Constant extrapolation for x > x_{n-1}
  return lut->points[lut->num_points - 1][1];
}